

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

double time_oo<std::discard_block_engine<std::subtract_with_carry_engine<unsigned_long,24ul,10ul,24ul>,223ul,23ul>>
                 (discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
                  *r)

{
  long lVar1;
  result_type rVar2;
  long lVar3;
  string res;
  double local_48;
  string local_40;
  double local_20;
  
  local_48 = 0.0;
  lVar3 = 0x1000000;
  lVar1 = std::chrono::_V2::system_clock::now();
  do {
    rVar2 = std::
            discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
            ::operator()(r);
    local_48 = local_48 + (double)(int)rVar2 * 5.960464122267631e-08 + 5.960464832810452e-08;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar3 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return local_48;
}

Assistant:

double time_oo(R &r) {
  double s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::utility::uniformoo<double>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}